

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void __thiscall gnuplotio::PlotData::PlotData(PlotData *this,PlotData *param_1)

{
  pointer pcVar1;
  bool bVar2;
  
  (this->plotspec)._M_dataplus._M_p = (pointer)&(this->plotspec).field_2;
  pcVar1 = (param_1->plotspec)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->plotspec)._M_string_length);
  this->has_data = param_1->has_data;
  bVar2 = param_1->is_inline;
  this->is_text = param_1->is_text;
  this->is_inline = bVar2;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  pcVar1 = (param_1->data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->data,pcVar1,pcVar1 + (param_1->data)._M_string_length);
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (param_1->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + (param_1->filename)._M_string_length);
  (this->arr_or_rec)._M_dataplus._M_p = (pointer)&(this->arr_or_rec).field_2;
  pcVar1 = (param_1->arr_or_rec)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arr_or_rec,pcVar1,pcVar1 + (param_1->arr_or_rec)._M_string_length);
  (this->bin_fmt)._M_dataplus._M_p = (pointer)&(this->bin_fmt).field_2;
  pcVar1 = (param_1->bin_fmt)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->bin_fmt,pcVar1,pcVar1 + (param_1->bin_fmt)._M_string_length);
  (this->bin_size)._M_dataplus._M_p = (pointer)&(this->bin_size).field_2;
  pcVar1 = (param_1->bin_size)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->bin_size,pcVar1,pcVar1 + (param_1->bin_size)._M_string_length);
  return;
}

Assistant:

PlotData() { }